

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *__s;
  lua_Integer lVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  char *__n_00;
  long lVar7;
  long lVar8;
  ulong n;
  bool bVar9;
  size_t l2;
  size_t l1;
  MatchState ms;
  
  pcVar3 = luaL_checklstring(L,1,&l1);
  __s = luaL_checklstring(L,2,&l2);
  lVar4 = luaL_optinteger(L,3,1);
  lVar7 = (lVar4 >> 0x3f & l1 + 1) + lVar4;
  lVar8 = 0;
  if (0 < lVar7) {
    lVar8 = lVar7;
  }
  n = lVar8 - 1U;
  if (l1 <= lVar8 - 1U) {
    n = l1;
  }
  if (lVar7 < 1) {
    n = 0;
  }
  if ((find == 0) ||
     ((iVar2 = lua_toboolean(L,4), iVar2 == 0 &&
      (pcVar5 = strpbrk(__s,"^$*+?.([%-"), pcVar5 != (char *)0x0)))) {
    cVar1 = *__s;
    ms.src_end = pcVar3 + l1;
    pcVar5 = pcVar3 + n;
    ms.src_init = pcVar3;
    ms.L = L;
    do {
      n = n + 1;
      ms.level = 0;
      pcVar6 = match(&ms,pcVar5,__s + (cVar1 == '^'));
      if (pcVar6 != (char *)0x0) {
        if (find != 0) {
          lua_pushinteger(L,n);
          lua_pushinteger(L,(long)pcVar6 - (long)pcVar3);
          iVar2 = push_captures(&ms,(char *)0x0,(char *)0x0);
          return iVar2 + 2;
        }
        iVar2 = push_captures(&ms,pcVar5,pcVar6);
        return iVar2;
      }
    } while ((cVar1 != '^') && (bVar9 = pcVar5 < ms.src_end, pcVar5 = pcVar5 + 1, bVar9));
  }
  else {
    pcVar5 = pcVar3 + n;
    if (l2 == 0) {
      if (pcVar3 != (char *)0x0) {
LAB_00112c0f:
        lua_pushinteger(L,(lua_Integer)(pcVar5 + (1 - (long)pcVar3)));
        lua_pushinteger(L,(lua_Integer)(pcVar5 + (l2 - (long)pcVar3)));
        return 2;
      }
    }
    else if (l2 <= l1 - n) {
      __n = l2 - 1;
      __n_00 = (char *)((l1 - n) - __n);
      pcVar6 = pcVar5;
      while ((__n_00 != (char *)0x0 &&
             (pcVar5 = (char *)memchr(pcVar6,(int)*__s,(size_t)__n_00), pcVar5 != (char *)0x0))) {
        __s1 = pcVar5 + 1;
        iVar2 = bcmp(__s1,__s + 1,__n);
        if (iVar2 == 0) goto LAB_00112c0f;
        __n_00 = pcVar6 + ((long)__n_00 - (long)__s1);
        pcVar6 = __s1;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t l1, l2;
  const char *s = luaL_checklstring(L, 1, &l1);
  const char *p = luaL_checklstring(L, 2, &l2);
  ptrdiff_t init = posrelat(luaL_optinteger(L, 3, 1), l1) - 1;
  if (init < 0) init = 0;
  else if ((size_t)(init) > l1) init = (ptrdiff_t)l1;
  if (find && (lua_toboolean(L, 4) ||  /* explicit request? */
      strpbrk(p, SPECIALS) == NULL)) {  /* or no special characters? */
    /* do a plain search */
    const char *s2 = lmemfind(s+init, l1-init, p, l2);
    if (s2) {
      lua_pushinteger(L, s2-s+1);
      lua_pushinteger(L, s2-s+l2);
      return 2;
    }
  }
  else {
    MatchState ms;
    int anchor = (*p == '^') ? (p++, 1) : 0;
    const char *s1=s+init;
    ms.L = L;
    ms.src_init = s;
    ms.src_end = s+l1;
    do {
      const char *res;
      ms.level = 0;
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1-s+1);  /* start */
          lua_pushinteger(L, res-s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}